

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O0

void __thiscall
booster::aio::basic_socket::set_option
          (basic_socket *this,integer_option_type opt,int v,error_code *e)

{
  native_type nVar1;
  undefined8 *in_RCX;
  int in_ESI;
  basic_io_device *in_RDI;
  error_code eVar2;
  int res;
  char *p;
  int value;
  undefined4 uStack_3c;
  int local_2c;
  undefined1 local_1c [4];
  undefined8 *local_18;
  
  local_2c = 0;
  local_18 = in_RCX;
  if (in_ESI == 0) {
    nVar1 = basic_io_device::native(in_RDI);
    local_2c = setsockopt(nVar1,1,8,local_1c,4);
  }
  else if (in_ESI == 1) {
    nVar1 = basic_io_device::native(in_RDI);
    local_2c = setsockopt(nVar1,1,7,local_1c,4);
  }
  if (local_2c < 0) {
    eVar2 = socket_details::geterror();
    *local_18 = CONCAT44(uStack_3c,eVar2._M_value);
    local_18[1] = eVar2._M_cat;
  }
  return;
}

Assistant:

void basic_socket::set_option(integer_option_type opt,int v,system::error_code &e)
{
	int value = v;
	char const *p=reinterpret_cast<char const *>(&value);
	int res = 0;
	switch(opt) {
	case receive_buffer_size:
		res=::setsockopt(native(),SOL_SOCKET,SO_RCVBUF,p,sizeof(value));
		break;
	case send_buffer_size:
		res=::setsockopt(native(),SOL_SOCKET,SO_SNDBUF,p,sizeof(value));
		break;
	default:
		;
	}
	if(res < 0)
		e=geterror();
}